

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

int __thiscall ON_PolyCurve::FindNextGap(ON_PolyCurve *this,int segment_index0)

{
  bool bVar1;
  int iVar2;
  int local_24;
  int gap_index;
  int count;
  int segment_index0_local;
  ON_PolyCurve *this_local;
  
  if (-1 < segment_index0) {
    iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
    for (local_24 = segment_index0 + 1; local_24 < iVar2; local_24 = local_24 + 1) {
      bVar1 = HasGapAt(this,local_24 + -1);
      if (bVar1) {
        return local_24;
      }
    }
  }
  return 0;
}

Assistant:

int ON_PolyCurve::FindNextGap(int segment_index0) const
{
  if ( segment_index0 >= 0 )
  {
    const int count = m_segment.Count();
    for (int gap_index = segment_index0+1; gap_index < count; gap_index++ )
    {
      if ( HasGapAt(gap_index-1) )
        return gap_index;
    }
  }
  return 0;
}